

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert-llama2c-to-ggml.cpp
# Opt level: O0

string * __thiscall my_llama_file::read_string_abi_cxx11_(my_llama_file *this,uint32_t len)

{
  char *pcVar1;
  uint in_EDX;
  my_llama_file *in_RSI;
  string *in_RDI;
  vector<char,_std::allocator<char>_> chars;
  string *ptr;
  allocator local_45 [20];
  allocator<char> local_31 [29];
  uint local_14;
  
  ptr = in_RDI;
  local_14 = in_EDX;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)in_RSI,(size_type)ptr,(allocator_type *)in_RDI);
  std::allocator<char>::~allocator(local_31);
  std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0x15d581);
  read_raw(in_RSI,ptr,(size_t)in_RDI);
  pcVar1 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x15d5a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pcVar1,(ulong)local_14,local_45);
  std::allocator<char>::~allocator((allocator<char> *)local_45);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)in_RDI);
  return ptr;
}

Assistant:

std::string read_string(std::uint32_t len) {
        std::vector<char> chars(len);
        read_raw(chars.data(), len);
        return std::string(chars.data(), len);
    }